

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O1

void __thiscall HDual::chooseColumn_slice(HDual *this,HVector *row_ep)

{
  HDualRow *this_00;
  double dVar1;
  HModel *pHVar2;
  undefined8 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined4 uVar6;
  HDualRow *pHVar7;
  HVector *this_01;
  HMatrix *this_02;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (this->invertHint != 0) {
    return;
  }
  uVar3 = rdtsc();
  uVar6 = (undefined4)((ulong)uVar3 >> 0x20);
  auVar4._4_4_ = uVar6;
  auVar4._0_4_ = uVar6;
  auVar4._8_4_ = 0;
  auVar9._0_12_ = auVar4 << 0x20;
  auVar9._12_4_ = 0x45300000;
  (this->model->timer).itemStart[0xc] =
       (auVar9._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
  this_00 = &this->dualRow;
  HDualRow::clear(this_00);
  (this->dualRow).workDelta = this->deltaPrimal;
  HDualRow::create_Freemove(this_00,row_ep);
  HDualRow::choose_makepack(this_00,row_ep,this->numCol);
  HDualRow::choose_possible(this_00);
  if (0 < this->slice_num) {
    this_01 = this->slice_row_ap;
    this_02 = this->slice_matrix;
    pHVar7 = this->slice_dualRow;
    lVar8 = 0;
    do {
      HVector::clear(this_01);
      HMatrix::price_by_row(this_02,this_01,row_ep);
      HDualRow::clear(pHVar7);
      pHVar7->workDelta = this->deltaPrimal;
      HDualRow::choose_makepack(pHVar7,this_01,this->slice_start[lVar8]);
      HDualRow::choose_possible(pHVar7);
      lVar8 = lVar8 + 1;
      pHVar7 = pHVar7 + 1;
      this_02 = this_02 + 1;
      this_01 = this_01 + 1;
    } while (lVar8 < this->slice_num);
  }
  if (0 < this->slice_num) {
    pHVar7 = this->slice_dualRow;
    lVar8 = 0;
    do {
      HDualRow::choose_joinpack(this_00,pHVar7);
      lVar8 = lVar8 + 1;
      pHVar7 = pHVar7 + 1;
    } while (lVar8 < this->slice_num);
  }
  this->columnIn = -1;
  if (((this->dualRow).workTheta <= 0.0) || ((this->dualRow).workCount == 0)) {
    this->invertHint = 5;
  }
  else {
    pHVar2 = this->model;
    uVar3 = rdtsc();
    uVar6 = (undefined4)((ulong)uVar3 >> 0x20);
    auVar5._4_4_ = uVar6;
    auVar5._0_4_ = uVar6;
    auVar5._8_4_ = 0;
    auVar10._0_12_ = auVar5 << 0x20;
    auVar10._12_4_ = 0x45300000;
    (pHVar2->timer).itemTicks[0xc] =
         (((auVar10._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) -
         (pHVar2->timer).itemStart[0xc]) + (pHVar2->timer).itemTicks[0xc];
    HDualRow::choose_final(this_00);
    HDualRow::delete_Freemove(this_00);
    this->columnIn = (this->dualRow).workPivot;
    dVar1 = (this->dualRow).workTheta;
    this->alphaRow = (this->dualRow).workAlpha;
    this->thetaDual = dVar1;
  }
  return;
}

Assistant:

void HDual::chooseColumn_slice(HVector *row_ep) {
	if (invertHint)
		return;

	model->timer.recordStart(HTICK_CHUZC1);
	dualRow.clear();
	dualRow.workDelta = deltaPrimal;
	dualRow.create_Freemove(row_ep);

	// Row_ep:         PACK + CC1
#pragma omp task
	{

		dualRow.choose_makepack(row_ep, numCol);
		dualRow.choose_possible();
	}

	// Row_ap: PRICE + PACK + CC1
	for (int i = 0; i < slice_num; i++) {
#pragma omp task
		{
			slice_row_ap[i].clear();
			slice_matrix[i].price_by_row(slice_row_ap[i], *row_ep);

			slice_dualRow[i].clear();
			slice_dualRow[i].workDelta = deltaPrimal;
			slice_dualRow[i].choose_makepack(&slice_row_ap[i], slice_start[i]);
			slice_dualRow[i].choose_possible();
		}
	}
#pragma omp taskwait

	// Join CC1 results here
	for (int i = 0; i < slice_num; i++)
		dualRow.choose_joinpack(&slice_dualRow[i]);

	// Infeasible we created before
	columnIn = -1;
	if (dualRow.workTheta <= 0 || dualRow.workCount == 0) {
   	  invertHint = invertHint_possiblyDualUnbounded; // Was 1
		return;
	}
	model->timer.recordFinish(HTICK_CHUZC1);

	// Choose column 2, This only happens if didn't go out
	dualRow.choose_final();
	dualRow.delete_Freemove();
	columnIn = dualRow.workPivot;
	alphaRow = dualRow.workAlpha;
	thetaDual = dualRow.workTheta;
}